

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O2

deBool qpTestLog_writeMessage(qpTestLog *log,char *format,...)

{
  char in_AL;
  deBool dVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_4c8 [16];
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  char buffer [1024];
  
  args[0].reg_save_area = local_4c8;
  if (in_AL != '\0') {
    local_498 = in_XMM0_Qa;
    local_488 = in_XMM1_Qa;
    local_478 = in_XMM2_Qa;
    local_468 = in_XMM3_Qa;
    local_458 = in_XMM4_Qa;
    local_448 = in_XMM5_Qa;
    local_438 = in_XMM6_Qa;
    local_428 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 0x10;
  args[0].fp_offset = 0x30;
  buffer[0x3ff] = '\0';
  local_4b8 = in_RDX;
  local_4b0 = in_RCX;
  local_4a8 = in_R8;
  local_4a0 = in_R9;
  vsnprintf(buffer,0x400,format,args);
  puts(buffer);
  dVar1 = qpTestLog_writeKeyValuePair
                    (log,"Text",(char *)0x0,(char *)0x0,(char *)0x0,QP_KEY_TAG_LAST,buffer);
  return dVar1;
}

Assistant:

deBool qpTestLog_writeMessage (qpTestLog* log, const char* format, ...)
{
	char	buffer[1024];
	va_list	args;

	/* \todo [petri] Handle buffer overflows! */

	va_start(args, format);
	buffer[DE_LENGTH_OF_ARRAY(buffer) - 1] = 0;
	vsnprintf(buffer, sizeof(buffer), format, args);
	va_end(args);

	printf("%s\n", buffer);

	/* <Text>text</Text> */
	return qpTestLog_writeKeyValuePair(log, "Text", DE_NULL, DE_NULL, DE_NULL, QP_KEY_TAG_LAST, buffer);
}